

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QXmlStreamReader::addExtraNamespaceDeclarations
          (QXmlStreamReader *this,QXmlStreamNamespaceDeclarations *extraNamespaceDeclarations)

{
  QXmlStreamNamespaceDeclaration *extraNamespaceDeclaration;
  QXmlStreamNamespaceDeclaration *extraNamespaceDeclaration_00;
  long lVar1;
  
  lVar1 = (extraNamespaceDeclarations->d).size;
  if (lVar1 != 0) {
    extraNamespaceDeclaration_00 = (extraNamespaceDeclarations->d).ptr;
    lVar1 = lVar1 * 0x30;
    do {
      addExtraNamespaceDeclaration(this,extraNamespaceDeclaration_00);
      extraNamespaceDeclaration_00 = extraNamespaceDeclaration_00 + 1;
      lVar1 = lVar1 + -0x30;
    } while (lVar1 != 0);
  }
  return;
}

Assistant:

const T *constEnd() const noexcept { return data() + size; }